

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRule.c
# Opt level: O3

int Amap_CreateCheckAllZero(Vec_Ptr_t *vVecNods)

{
  long lVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(uint)vVecNods->nSize;
  do {
    if ((int)uVar2 < 1) {
      return 1;
    }
    lVar1 = uVar2 - 1;
  } while ((*(int *)((long)vVecNods->pArray[lVar1] + 4) == 1) &&
          (uVar2 = uVar2 - 1, **(int **)((long)vVecNods->pArray[lVar1] + 8) == 0));
  return 0;
}

Assistant:

int Amap_CreateCheckAllZero( Vec_Ptr_t * vVecNods )
{
    Vec_Int_t * vNods;
    int i;
    Vec_PtrForEachEntryReverse( Vec_Int_t *, vVecNods, vNods, i )
        if ( Vec_IntSize(vNods) != 1 || Vec_IntEntry(vNods,0) != 0 )
            return 0;
    return 1;
}